

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::DHMap<unsigned_int,_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
          (DHMap<unsigned_int,_int,_Lib::IdentityHash,_Lib::DefaultHash> *this)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  
  uVar2 = this->_timestamp;
  uVar1 = uVar2 + 1;
  this->_timestamp = uVar1;
  this->_size = 0;
  this->_deleted = 0;
  if ((uVar1 & 0x3fffffff) < uVar2) {
    this->_timestamp = 1;
    for (pEVar3 = this->_afterLast; pEVar3 != this->_entries; pEVar3 = pEVar3 + -1) {
      pEVar3[-1].field_0._infoData = pEVar3[-1].field_0._infoData & 3;
    }
  }
  return;
}

Assistant:

void reset()
  {
    unsigned oldTS=_timestamp;
    _timestamp++;
    _size=0;
    _deleted=0;

    if(oldTS>(_timestamp&0x3FFFFFFF)) {
      //We store timestamp only in 30 bits in entries,
      //and they've just overflowed.
      _timestamp=1;
      Entry* pe=_afterLast;
      while(pe--!=_entries) {
	pe->_info.timestamp=0;
      }
    }
  }